

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O1

LengthMod __thiscall absl::lts_20250127::str_format_internal::ConvTag::as_length(ConvTag *this)

{
  if ((char)this->tag_ < '\0') {
    __assert_fail("is_length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x6a,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
  }
  __assert_fail("!is_conv()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,0x69,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
}

Assistant:

constexpr LengthMod as_length() const {
    assert(!is_conv());
    assert(is_length());
    assert(!is_flags());
    return static_cast<LengthMod>(tag_ & 0x3F);
  }